

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O2

int cuddComputeFloorLog2(uint value)

{
  int floorLog;
  
  floorLog = 0;
  for (; 1 < value; value = value >> 1) {
    floorLog = floorLog + 1;
  }
  return floorLog;
}

Assistant:

int
cuddComputeFloorLog2(
  unsigned int value)
{
    int floorLog = 0;
#ifdef DD_DEBUG
    assert(value > 0);
#endif
    while (value > 1) {
        floorLog++;
        value >>= 1;
    }
    return(floorLog);

}